

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumprwtree.cpp
# Opt level: O2

void readchunk(StreamFile *s,ChunkHeaderInfo *h,int level)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  ChunkHeaderInfo nh;
  
  iVar1 = 0;
  if (0 < level) {
    iVar1 = level;
  }
  while (iVar1 != 0) {
    printf("  ");
    iVar1 = iVar1 + -1;
  }
  pcVar3 = getChunkName(h->type);
  uVar4 = h->length;
  iVar1 = (*(s->super_Stream)._vptr_Stream[6])(s);
  uVar2 = (*(s->super_Stream)._vptr_Stream[6])(s);
  printf("%s (%x bytes @ 0x%x/0x%x) - [0x%x]\n",pcVar3,(ulong)uVar4,(ulong)(iVar1 - 0xc),
         (ulong)uVar2,(ulong)h->type);
  iVar1 = (*(s->super_Stream)._vptr_Stream[6])(s);
  uVar4 = iVar1 + h->length;
  while( true ) {
    uVar2 = (*(s->super_Stream)._vptr_Stream[6])(s);
    if (uVar4 <= uVar2) {
      return;
    }
    rw::readChunkHeaderInfo(&s->super_Stream,&nh);
    if ((nh.version != h->version) || (nh.build != h->build)) break;
    readchunk(s,&nh,level + 1);
    if (h->type == 0x510) {
      (*(s->super_Stream)._vptr_Stream[5])(s,(ulong)uVar4,0);
    }
  }
  (*(s->super_Stream)._vptr_Stream[5])(s,(ulong)(h->length - 0xc),1);
  return;
}

Assistant:

void
readchunk(StreamFile *s, ChunkHeaderInfo *h, int level)
{
	for(int i = 0; i < level; i++)
		printf("  ");
	const char *name = getChunkName(h->type);
	printf("%s (%x bytes @ 0x%x/0x%x) - [0x%x]\n",
		name, h->length, s->tell()-12, s->tell(), h->type);

	uint32 end = s->tell() + h->length;
	while(s->tell() < end){
		ChunkHeaderInfo nh;
		readChunkHeaderInfo(s, &nh);
		if(nh.version == h->version && nh.build == h->build){
			readchunk(s, &nh, level+1);
			if(h->type == 0x510)
				s->seek(end, 0);
		}else{
			s->seek(h->length-12);
			break;
		}
	}
}